

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atkdp.cpp
# Opt level: O0

void anothersearch(int bomberNum,int bomberID,_func_void_BelongStructure_ptr_float_int_ptr *func)

{
  int iVar1;
  __type_conflict _Var2;
  int iVar3;
  reference pvVar4;
  reference __rhs;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  float fVar9;
  int taccu;
  int tdamage;
  Plane *tplane;
  int i;
  _func_void_BelongStructure_ptr_float_int_ptr *func_local;
  int bomberID_local;
  int bomberNum_local;
  
  lVar5 = (long)usedGrid[0];
  lVar6 = (long)usedGrid[1];
  lVar7 = (long)usedGrid[2];
  lVar8 = (long)usedGrid[3];
  fVar9 = formularAllShipAtk(shipAtk);
  (*func)(dpRes[lVar5][lVar6][lVar7] + lVar8,fVar9,belonging);
  if (bomberNum != 0) {
    tplane._4_4_ = 0;
    if (0 < bomberID) {
      pvVar4 = std::vector<Plane,_std::allocator<Plane>_>::operator[](&planeVecA,(long)bomberID);
      __rhs = std::vector<Plane,_std::allocator<Plane>_>::operator[]
                        (&planeVecA,(long)(bomberID + -1));
      _Var2 = std::operator==(&pvVar4->name,&__rhs->name);
      if (_Var2) {
        tplane._4_4_ = belonging[bomberID + -1];
      }
    }
    pvVar4 = std::vector<Plane,_std::allocator<Plane>_>::operator[](&planeVecA,(long)bomberID);
    iVar3 = formulaDamage(pvVar4);
    iVar1 = pvVar4->accuracy;
    for (; tplane._4_4_ < carrierNum; tplane._4_4_ = tplane._4_4_ + 1) {
      if (usedGrid[tplane._4_4_] < availGrid[tplane._4_4_]) {
        shipAtk[tplane._4_4_] = iVar3 + shipAtk[tplane._4_4_];
        shipAccu[tplane._4_4_] = iVar1 + shipAccu[tplane._4_4_];
        usedGrid[tplane._4_4_] = usedGrid[tplane._4_4_] + 1;
        belonging[bomberID] = tplane._4_4_;
        anothersearch(bomberNum + -1,bomberID + 1,func);
        usedGrid[tplane._4_4_] = usedGrid[tplane._4_4_] + -1;
        shipAccu[tplane._4_4_] = shipAccu[tplane._4_4_] - iVar1;
        shipAtk[tplane._4_4_] = shipAtk[tplane._4_4_] - iVar3;
      }
    }
  }
  return;
}

Assistant:

void anothersearch(int bomberNum,int bomberID,void(* func)(BelongStructure *,float ,int *)){
    func(&dpRes[usedGrid[0]][usedGrid[1]][usedGrid[2]][usedGrid[3]],formularAllShipAtk(shipAtk),belonging);
    if(bomberNum == 0){//��������
        return;
    }

    int i=0;
    //���������������ظ���
    if(bomberID > 0 && planeVecA[bomberID].name == planeVecA[bomberID - 1].name)
        i = belonging[bomberID - 1];
    Plane &tplane = planeVecA[bomberID];
    int tdamage = formulaDamage(tplane), taccu = tplane.accuracy;
    for(; i < carrierNum; i++){
        if(usedGrid[i]<availGrid[i]){
            shipAtk[i] += tdamage;
            shipAccu[i] += taccu;
            usedGrid[i] ++ ;
            belonging[bomberID] = i;
            anothersearch(bomberNum - 1,bomberID + 1,func);
            usedGrid[i] -- ;
            shipAccu[i] -= taccu;
            shipAtk[i] -= tdamage;
        }
    }
}